

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_binary.h
# Opt level: O3

vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
* __thiscall
lf::mesh::utils::internal::OperatorMultiplication::operator()
          (vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           *__return_storage_ptr__,OperatorMultiplication *this,
          vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          *u,vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             *v,int param_3)

{
  double *pdVar1;
  double *pdVar2;
  pointer pMVar3;
  pointer pMVar4;
  long lVar5;
  long lVar6;
  allocator_type local_39;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_38;
  
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(&local_38,
           (long)(u->
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(u->
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4,&local_39);
  pMVar3 = (u->
           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(u->
                super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 4;
    pMVar4 = (v->
             super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    lVar6 = 0;
    do {
      pdVar1 = (double *)
               ((long)&(pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                       m_storage.m_data + lVar6 * 2);
      pdVar2 = (double *)
               ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                       m_storage.m_data + lVar6 * 2);
      *(double *)
       ((long)((local_38.
                super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.array +
       lVar6) = pdVar1[1] * pdVar2[1] + *pdVar1 * *pdVar2;
      lVar6 = lVar6 + 8;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_38.
       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_38.
       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_38.
       super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_std::allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const std::vector<Eigen::Matrix<S1, R1, C1, O1, MR1, MC1>>& u,
                  const std::vector<Eigen::Matrix<S2, R2, C2, O2, MR2, MC2>>& v,
                  int /*unused*/) const {
    using scalar_t = decltype(S1(0) * S2(0));                      // NOLINT
    if constexpr (R1 != Eigen::Dynamic && C2 != Eigen::Dynamic) {  // NOLINT
      // The result is fixed size
      static_assert(C1 == Eigen::Dynamic || R2 == Eigen::Dynamic || C1 == R2,
                    "#cols of lhs doesn't match #rows of rhs");

      std::vector<Eigen::Matrix<scalar_t, R1, C2>> result(u.size());
      for (std::size_t i = 0; i < u.size(); ++i) {
        LF_ASSERT_MSG(u[i].cols() == v[i].rows(),
                      "#cols of lhs doesn't match #rows of rhs");
        result[i] = u[i] * v[i];
      }
      return result;
    } else {  // NOLINT
      // multiply dynamic sized matrices
      std::vector<Eigen::Matrix<scalar_t, Eigen::Dynamic, Eigen::Dynamic>>
          result;
      result.reserve(u.size());
      for (int i = 0; i < u.size(); ++i) {
        LF_ASSERT_MSG(u[i].cols() == v[i].rows(),
                      "#cols of lhs doesn't match #rows of rhs");
        result.emplace_back(u[i] * v[i]);
      }
      return result;
    }
  }